

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O3

int ptls_asn1_validation(uint8_t *bytes,size_t length,ptls_minicrypto_log_ctx_t *log_ctx)

{
  uint in_EAX;
  size_t sVar1;
  int iVar2;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  sVar1 = ptls_asn1_validation_recursive(bytes,length,(int *)((long)&uStack_28 + 4),0,log_ctx);
  iVar2 = uStack_28._4_4_;
  if ((sVar1 < length && uStack_28._4_4_ == 0) &&
     (iVar2 = 0x238, log_ctx != (ptls_minicrypto_log_ctx_t *)0x0)) {
    (*log_ctx->fn)(log_ctx->ctx,"Type too short, %d bytes only out of %d\n",sVar1 & 0xffffffff,
                   length & 0xffffffff);
  }
  return iVar2;
}

Assistant:

int ptls_asn1_validation(const uint8_t *bytes, size_t length, ptls_minicrypto_log_ctx_t *log_ctx)
{
    int decode_error = 0;
    size_t decoded = ptls_asn1_validation_recursive(bytes, length, &decode_error, 0, log_ctx);

    if (decode_error == 0 && decoded < length) {
        decode_error = PTLS_ERROR_BER_ELEMENT_TOO_SHORT;
        if (log_ctx != NULL) {
            log_ctx->fn(log_ctx->ctx, "Type too short, %d bytes only out of %d\n", (int)decoded, (int)length);
        }
    }

    return decode_error;
}